

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

int __thiscall cmCTest::GenerateNotesFile(cmCTest *this,char *cfiles)

{
  pointer pSVar1;
  bool bVar2;
  ostream *this_00;
  char *msg;
  allocator local_219;
  string local_218;
  vector<cmsys::String,_std::allocator<cmsys::String>_> local_1f8;
  string local_1e0 [48];
  undefined1 local_1b0 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_38 [8];
  VectorOfStrings files;
  char *cfiles_local;
  cmCTest *this_local;
  
  if (cfiles == (char *)0x0) {
    this_local._4_4_ = 1;
  }
  else {
    files.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)cfiles;
    std::vector<cmsys::String,_std::allocator<cmsys::String>_>::vector
              ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)local_38);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
    this_00 = std::operator<<((ostream *)local_1b0,"Create notes file");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    msg = (char *)std::__cxx11::string::c_str();
    Log(this,1,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
        ,0x6ad,msg,false);
    std::__cxx11::string::~string(local_1e0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
    pSVar1 = files.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_218,(char *)pSVar1,&local_219);
    cmsys::SystemTools::SplitString(&local_1f8,&local_218,';',false);
    std::vector<cmsys::String,_std::allocator<cmsys::String>_>::operator=
              ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)local_38,&local_1f8);
    std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector(&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator((allocator<char> *)&local_219);
    bVar2 = std::vector<cmsys::String,_std::allocator<cmsys::String>_>::empty
                      ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)local_38);
    if (bVar2) {
      this_local._4_4_ = 1;
    }
    else {
      this_local._4_4_ = GenerateNotesFile(this,(VectorOfStrings *)local_38);
    }
    std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector
              ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)local_38);
  }
  return this_local._4_4_;
}

Assistant:

int cmCTest::GenerateNotesFile(const char* cfiles)
{
  if ( !cfiles )
    {
    return 1;
    }

  VectorOfStrings files;

  cmCTestLog(this, OUTPUT, "Create notes file" << std::endl);

  files = cmSystemTools::SplitString(cfiles, ';');
  if (files.empty())
    {
    return 1;
    }

  return this->GenerateNotesFile(files);
}